

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void Search::clear_cache_hash_map(search_private *priv)

{
  hash_elem *phVar1;
  hash_elem *phVar2;
  hash_elem *phVar3;
  
  phVar3 = (priv->cache_hash_map).dat._begin;
  phVar1 = (priv->cache_hash_map).dat.end_array;
  phVar2 = phVar3;
  if (phVar3 != phVar1) {
    do {
      if (phVar3->occupied == true) {
        free(phVar3->key);
        phVar1 = (priv->cache_hash_map).dat.end_array;
      }
      phVar3 = phVar3 + 1;
      phVar2 = phVar1;
    } while (phVar3 != phVar1);
  }
  if ((priv->cache_hash_map).num_occupants != 0) {
    phVar3 = (priv->cache_hash_map).dat._begin;
    memset(phVar3,0,(long)phVar2 - (long)phVar3);
    (priv->cache_hash_map).last_position = 0;
    (priv->cache_hash_map).num_occupants = 0;
  }
  return;
}

Assistant:

void free_key(unsigned char* mem, scored_action) { free(mem); }